

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O3

void * bmp_read_pixel_data(FILE *fp,uint32_t offset,bmp_dib_header_t *dib_header,size_t *stride)

{
  int iVar1;
  ulong uVar2;
  void *__ptr;
  size_t sVar3;
  
  if (dib_header == (bmp_dib_header_t *)0x0) {
    __assert_fail("dib_header",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/cornerstonejs[P]charls/samples/convert.c/main.c"
                  ,0x55,
                  "void *bmp_read_pixel_data(FILE *, const uint32_t, const bmp_dib_header_t *, size_t *)"
                 );
  }
  if (stride == (size_t *)0x0) {
    __assert_fail("stride",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/cornerstonejs[P]charls/samples/convert.c/main.c"
                  ,0x56,
                  "void *bmp_read_pixel_data(FILE *, const uint32_t, const bmp_dib_header_t *, size_t *)"
                 );
  }
  if (dib_header->compress_type != 0) {
    __assert_fail("dib_header->compress_type == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/cornerstonejs[P]charls/samples/convert.c/main.c"
                  ,0x57,
                  "void *bmp_read_pixel_data(FILE *, const uint32_t, const bmp_dib_header_t *, size_t *)"
                 );
  }
  if (dib_header->depth != 0x18) {
    __assert_fail("dib_header->depth == 24",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/cornerstonejs[P]charls/samples/convert.c/main.c"
                  ,0x58,
                  "void *bmp_read_pixel_data(FILE *, const uint32_t, const bmp_dib_header_t *, size_t *)"
                 );
  }
  iVar1 = fseek((FILE *)fp,(ulong)offset,0);
  if (iVar1 == 0) {
    uVar2 = (ulong)dib_header->width * 3 + 3 & 0xfffffffffffffffc;
    *stride = uVar2;
    sVar3 = (long)dib_header->height * uVar2;
    __ptr = malloc(sVar3);
    if (__ptr != (void *)0x0) {
      sVar3 = fread(__ptr,sVar3,1,(FILE *)fp);
      if (sVar3 == 1) {
        return __ptr;
      }
      free(__ptr);
    }
  }
  return (void *)0x0;
}

Assistant:

static void* bmp_read_pixel_data(FILE* fp, const uint32_t offset, const bmp_dib_header_t* dib_header, size_t* stride)
{
    assert(fp);
    assert(dib_header);
    assert(stride);
    assert(dib_header->compress_type == 0);
    assert(dib_header->depth == 24);

    if (fseek(fp, (long)offset, SEEK_SET))
        return NULL;

    // The BMP format requires that the size of each row is rounded up to a multiple of 4 bytes by padding.
    *stride = ((dib_header->width * bytes_per_rgb_pixel) + 3) / 4 * 4;

    const size_t buffer_size = (size_t)dib_header->height * *stride;
    void* buffer = malloc(buffer_size);
    if (!buffer)
        return NULL;

    if (fread(buffer, buffer_size, 1, fp) != 1)
    {
        free(buffer);
        return NULL;
    }

    return buffer;
}